

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O2

void string_suite::test_literal_empty(void)

{
  encoder_type encoder;
  ostringstream result;
  undefined4 local_1cc;
  size_type local_1c8 [4];
  undefined **local_1a8 [5];
  ostringstream local_180 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_1a8[0] = &PTR__base_00114b78;
  local_1a8[1] = (undefined **)local_180;
  local_1c8[0] = trial::protocol::json::detail::basic_encoder<char,_24UL>::value
                           ((basic_encoder<char,_24UL> *)local_1a8,"");
  local_1cc = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(\"\")","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x22b,"void string_suite::test_literal_empty()",local_1c8,&local_1cc);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("result.str()","\"\\\"\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x22c,"void string_suite::test_literal_empty()",local_1c8,"\"\"");
  std::__cxx11::string::~string((string *)local_1c8);
  (*(code *)*local_1a8[0])();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_literal_empty()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(""), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "\"\"");
}